

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

void set_want_move_one_win(Am_Object *window,bool want_move)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  long *plVar4;
  int iVar5;
  int value;
  Am_Value v;
  Am_Value local_28;
  
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(window,299,1);
  Am_Value::operator=(&local_28,pAVar3);
  bVar1 = Am_Value::Valid(&local_28);
  if (bVar1) {
    iVar2 = Am_Value::operator_cast_to_int(&local_28);
    value = iVar2 + 1;
    iVar5 = 0;
    if (0 < iVar2) {
      iVar5 = iVar2 + -1;
    }
    bVar1 = iVar2 < 2;
  }
  else {
    iVar5 = 0;
    bVar1 = true;
    value = 1;
  }
  if (!want_move) {
    value = iVar5;
  }
  Am_Object::Set(window,299,value,1);
  if ((bVar1 | want_move) == 1) {
    pAVar3 = Am_Object::Get(window,0x7d2,0);
    plVar4 = (long *)Am_Value::operator_cast_to_void_(pAVar3);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 400))(plVar4,want_move);
    }
  }
  Am_Value::~Am_Value(&local_28);
  return;
}

Assistant:

void
set_want_move_one_win(Am_Object window, bool want_move)
{
  Am_Value v;
  int cnt = 0;
  int new_cnt = 0;
  v = window.Peek(Am_WINDOW_WANT_MOVE_CNT);
  if (v.Valid())
    cnt = v;
  if (want_move)
    new_cnt = cnt + 1;
  else if (cnt > 0)
    new_cnt = cnt - 1;

  window.Set(Am_WINDOW_WANT_MOVE_CNT, new_cnt, Am_OK_IF_NOT_THERE);
  //call if turning moving on, or if turning off and the count is 1 or less
  if (want_move || cnt <= 1) {
    Am_Drawonable *draw = Am_Drawonable::Narrow(window.Get(Am_DRAWONABLE));
    if (draw)
      draw->Set_Want_Move(want_move);
  }
}